

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O1

void anon_unknown.dwarf_1eb54::SelectOperation
               (InputOutputFormats input_format,InputOutputFormats output_format,
               vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
               *operations)

{
  (*(code *)(&DAT_00113e38 + *(int *)(&DAT_00113e38 + (ulong)input_format * 4)))();
  return;
}

Assistant:

void SelectOperation(
    sptk::SpectrumToSpectrum::InputOutputFormats input_format,
    sptk::SpectrumToSpectrum::InputOutputFormats output_format,
    std::vector<sptk::SpectrumToSpectrum::OperationInterface*>* operations) {
  switch (input_format) {
    case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          // nothing to do
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          operations->push_back(
              new LogAmplitudeSpectrumInDecibelsToLogAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          operations->push_back(
              new LogAmplitudeSpectrumInDecibelsToAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          operations->push_back(
              new LogAmplitudeSpectrumInDecibelsToPowerSpectrum());
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          operations->push_back(
              new LogAmplitudeSpectrumToLogAmplitudeSpectrumInDecibels());
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          // nothing to do
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          operations->push_back(new LogAmplitudeSpectrumToAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          operations->push_back(new LogAmplitudeSpectrumToPowerSpectrum());
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          operations->push_back(
              new AmplitudeSpectrumToLogAmplitudeSpectrumInDecibels());
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          operations->push_back(new AmplitudeSpectrumToLogAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          // nothing to do
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          operations->push_back(new AmplitudeSpectrumToPowerSpectrum());
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    case sptk::SpectrumToSpectrum::kPowerSpectrum: {
      switch (output_format) {
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrumInDecibels: {
          operations->push_back(
              new PowerSpectrumToLogAmplitudeSpectrumInDecibels());
          break;
        }
        case sptk::SpectrumToSpectrum::kLogAmplitudeSpectrum: {
          operations->push_back(new PowerSpectrumToLogAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kAmplitudeSpectrum: {
          operations->push_back(new PowerSpectrumToAmplitudeSpectrum());
          break;
        }
        case sptk::SpectrumToSpectrum::kPowerSpectrum: {
          // nothing to do
          break;
        }
        default: {
          return;
        }
      }
      break;
    }
    default: {
      return;
    }
  }
}